

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::DoQueueTrackedObject(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->queueTrackedObject == false) && ((~(this->collectionState).value & 0x2001) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f2,"(this->queueTrackedObject || !this->IsConcurrentMarkState())",
                       "this->queueTrackedObject || !this->IsConcurrentMarkState()");
    if (!bVar2) goto LAB_007179f1;
    *puVar3 = 0;
  }
  if ((this->queueTrackedObject == false) && (this->isProcessingTrackedObjects == false)) {
    bVar2 = HasPendingTrackObjects(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x8f3,
                         "(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects())"
                         ,
                         "this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects()"
                        );
      if (!bVar2) goto LAB_007179f1;
      *puVar3 = 0;
    }
  }
  if (((this->queueTrackedObject == false) && (this->inPartialCollectMode == false)) &&
     ((this->collectionState).value == CollectionStateParallelMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f5,
                       "(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark))"
                       ,
                       "this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark)"
                      );
    if (!bVar2) goto LAB_007179f1;
    *puVar3 = 0;
  }
  if ((this->queueTrackedObject == true) &&
     (((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
       (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
       &this->clientTrackedObjectList || (this->inPartialCollectMode == true)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f6,
                       "(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode))"
                       ,
                       "!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode)"
                      );
    if (!bVar2) {
LAB_007179f1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->queueTrackedObject;
}

Assistant:

bool
Recycler::DoQueueTrackedObject() const
{
    Assert(this->queueTrackedObject || !this->IsConcurrentMarkState());
    Assert(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects());
#if ENABLE_PARTIAL_GC
    Assert(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark));
    Assert(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode));
#else
    Assert(this->queueTrackedObject || !(this->collectionState == CollectionStateParallelMark));
#endif
    return this->queueTrackedObject;
}